

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeSlice(ConvertLayerParameters layerParameters)

{
  uint uVar1;
  Rep *pRVar2;
  string *psVar3;
  ConvolutionLayerParams *pCVar4;
  uint __val;
  Type *pTVar5;
  uint uVar6;
  Type *pTVar7;
  SplitLayerParams *this;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint __len;
  void **ppvVar11;
  SliceParameter *pSVar12;
  long lVar13;
  long in_stack_00000008;
  string *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  int *in_stack_00000048;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string local_e0;
  string *local_c0;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  Type *local_38;
  
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  local_38 = google::protobuf::internal::RepeatedPtrFieldBase::
             Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                       ((RepeatedPtrFieldBase *)in_stack_00000018,(Type *)0x0);
  if (((pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar7->top_).super_RepeatedPtrFieldBase.current_size_ < 2)) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Must have 1 input and more than 1 output","");
    errorInCaffeProto(&local_e0,(pTVar7->name_).ptr_,(pTVar7->type_).ptr_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  local_c0 = in_stack_00000018;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (pTVar7->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar10 = (long)(pTVar7->bottom_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar10 != 0) {
    lVar13 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,*(value_type **)((long)ppvVar11 + lVar13));
      lVar13 = lVar13 + 8;
    } while (lVar10 * 8 != lVar13);
  }
  pRVar2 = (pTVar7->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  lVar10 = (long)(pTVar7->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar10 != 0) {
    lVar13 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,*(value_type **)((long)ppvVar11 + lVar13));
      lVar13 = lVar13 + 8;
    } while (lVar10 * 8 != lVar13);
  }
  convertCaffeMetadata
            ((pTVar7->name_).ptr_,&local_58,&local_78,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_c0,
             in_stack_00000028);
  pSVar12 = pTVar7->slice_param_;
  if (pSVar12 == (SliceParameter *)0x0) {
    pSVar12 = (SliceParameter *)&caffe::_SliceParameter_default_instance_;
  }
  if (pSVar12->axis_ != 1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"axis","");
    psVar3 = (pTVar7->name_).ptr_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Slice","");
    uVar1 = pSVar12->axis_;
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar6 = 4;
      do {
        __len = uVar6;
        uVar8 = (uint)uVar9;
        if (uVar8 < 100) {
          __len = __len - 2;
          goto LAB_003e584a;
        }
        if (uVar8 < 1000) {
          __len = __len - 1;
          goto LAB_003e584a;
        }
        if (uVar8 < 10000) goto LAB_003e584a;
        uVar9 = uVar9 / 10000;
        uVar6 = __len + 4;
      } while (99999 < uVar8);
      __len = __len + 1;
    }
LAB_003e584a:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_c0 = psVar3;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
    unsupportedCaffeParrameterWithOption(&local_e0,local_c0,&local_b8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pSVar12->slice_point_).current_size_ != 0) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"slice_point","");
    psVar3 = (pTVar7->name_).ptr_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Slice","");
    unsupportedCaffeParrameter(&local_e0,psVar3,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar5 = local_38;
  if (local_38->_oneof_case_[0] != 0x14a) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(local_38);
    pTVar5->_oneof_case_[0] = 0x14a;
    this = (SplitLayerParams *)operator_new(0x20);
    CoreML::Specification::SplitLayerParams::SplitLayerParams(this);
    (pTVar5->layer_).split_ = this;
  }
  lVar10 = (long)(pTVar7->top_).super_RepeatedPtrFieldBase.current_size_;
  if (-1 < lVar10) {
    pCVar4 = (pTVar5->layer_).convolution_;
    (pCVar4->kernelsize_).current_size_ = (int)lVar10;
    (pCVar4->kernelsize_).total_size_ = (int)((ulong)lVar10 >> 0x20);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    return;
  }
  __assert_fail("topSize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Slice.cpp"
                ,0x39,
                "void CoreMLConverter::convertCaffeSlice(CoreMLConverter::ConvertLayerParameters)");
}

Assistant:

void CoreMLConverter::convertCaffeSlice(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() <= 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and more than 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);

    const caffe::SliceParameter& caffeLayerParams = caffeLayer.slice_param();
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis()!=1){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(), "Slice",std::to_string(caffeLayerParams.axis()));
    }
    if (caffeLayerParams.slice_point_size()!=0) {
        CoreMLConverter::unsupportedCaffeParrameter("slice_point", caffeLayer.name(), "Slice");
    }
    //***************************************************************
    
    Specification::SplitLayerParams* specLayerParams = specLayer->mutable_split();

    int topSize = caffeLayer.top_size();
    assert(topSize >= 0);
    specLayerParams->set_noutputs(static_cast<uint64_t>(topSize));
}